

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_oid.hpp
# Opt level: O2

void __thiscall jsoncons::bson::oid_t::oid_t(oid_t *this,string_view *str)

{
  uint8_t uVar1;
  byte bVar2;
  size_t i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 1) {
    uVar1 = parse_hex_char(str->_M_str[lVar3 * 2]);
    bVar2 = parse_hex_char(str->_M_str[lVar3 * 2 + 1]);
    (this->bytes_)._M_elems[lVar3] = bVar2 | uVar1 << 4;
  }
  return;
}

Assistant:

oid_t(const string_view& str)
        {
            for (std::size_t i = 0; i < bytes_.size(); i++) 
            {
               bytes_[i] = ((parse_hex_char (str[2 * i]) << 4) |
                           (parse_hex_char (str[2 * i + 1])));
            }
        }